

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_b.h
# Opt level: O0

arena_t * arena_choose(tsd_t *tsd,arena_t *arena)

{
  arena_t *paVar1;
  arena_t *in_stack_00000018;
  tsd_t *in_stack_00000020;
  
  paVar1 = arena_choose_impl(in_stack_00000020,in_stack_00000018,tsd._7_1_);
  return paVar1;
}

Assistant:

static inline arena_t *
arena_choose(tsd_t *tsd, arena_t *arena) {
	return arena_choose_impl(tsd, arena, false);
}